

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerScopedLdInst(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  LowererMD *this_00;
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  StackSym *sym;
  Instr *pIVar5;
  JITTimeFunctionBody *this_01;
  intptr_t address;
  AddrOpnd *opndArg;
  SymOpnd *pSVar6;
  RegOpnd *dst;
  
  LoadScriptContext(this,instr);
  pOVar3 = IR::Instr::UnlinkSrc2(instr);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1b18,"(src->IsRegOpnd())","Expected Reg opnd as src2");
    if (!bVar2) goto LAB_00547144;
    *puVar4 = 0;
  }
  sym = IR::Opnd::GetStackSym(pOVar3);
  pIVar5 = InsertLoadStackAddress(this,sym,instr,(RegOpnd *)0x0);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,pIVar5->m_dst);
  this_01 = Func::GetJITFunctionBody(this->m_func);
  address = JITTimeFunctionBody::GetRootObject(this_01);
  opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,instr->m_func,true,(Var)0x0);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
  pOVar3 = IR::Instr::UnlinkSrc1(instr);
  bVar2 = IR::Opnd::IsSymOpnd(pOVar3);
  if (bVar2) {
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar3);
    if (pSVar6->m_sym->m_kind == SymKindProperty) goto LAB_005470cf;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1b29,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as src");
  if (!bVar2) {
LAB_00547144:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_005470cf:
  LoadPropertySymAsArgument(this,instr,pOVar3);
  pIVar5 = LowererMD::ChangeToHelperCall
                     (this_00,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
                      (PropertySymOpnd *)0x0,false);
  dst = IR::RegOpnd::New(sym,TyVar,this->m_func);
  pSVar6 = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
  InsertMove(&dst->super_Opnd,&pSVar6->super_Opnd,pIVar5,true);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedLdInst(IR::Instr *instr, IR::JnHelperMethod helperMethod)
{
    IR::Opnd *src;
    IR::Instr *instrPrev;

    // last argument is the scriptContext
    instrPrev = LoadScriptContext(instr);
    src = instr->UnlinkSrc2();
    AssertMsg(src->IsRegOpnd(), "Expected Reg opnd as src2");

    // __out Var*. The StackSym is allocated in irbuilder, and here we need to insert a lea
    StackSym* dstSym = src->GetStackSym();
    IR::Instr *load = InsertLoadStackAddress(dstSym, instr);
    IR::Opnd* tempOpnd = load->GetDst();
    m_lowererMD.LoadHelperArgument(instr, tempOpnd);

    // now 3rd last argument is the rootObject of the function. Need to add addrOpnd to
    // pass in the address of the roobObject.
    IR::Opnd * srcOpnd;
    intptr_t rootObject = m_func->GetJITFunctionBody()->GetRootObject();
    srcOpnd = IR::AddrOpnd::New(rootObject, IR::AddrOpndKindDynamicVar, instr->m_func, true);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, srcOpnd);

    // no change, the property field built from irbuilder.
    src = instr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");
    this->LoadPropertySymAsArgument(instr, src);

    instrPrev = m_lowererMD.ChangeToHelperCall(instr, helperMethod);

    IR::RegOpnd* regOpnd = IR::RegOpnd::New(dstSym, TyVar, m_func);
    IR::SymOpnd*symOpnd = IR::SymOpnd::New(dstSym, TyVar, m_func);
    this->InsertMove(regOpnd, symOpnd, instrPrev);

    return instrPrev;
}